

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

void __thiscall mkvparser::SegmentInfo::~SegmentInfo(SegmentInfo *this)

{
  if (this->m_pMuxingAppAsUTF8 != (char *)0x0) {
    operator_delete__(this->m_pMuxingAppAsUTF8);
  }
  this->m_pMuxingAppAsUTF8 = (char *)0x0;
  if (this->m_pWritingAppAsUTF8 != (char *)0x0) {
    operator_delete__(this->m_pWritingAppAsUTF8);
  }
  this->m_pWritingAppAsUTF8 = (char *)0x0;
  if (this->m_pTitleAsUTF8 != (char *)0x0) {
    operator_delete__(this->m_pTitleAsUTF8);
  }
  this->m_pTitleAsUTF8 = (char *)0x0;
  return;
}

Assistant:

SegmentInfo::~SegmentInfo() {
  delete[] m_pMuxingAppAsUTF8;
  m_pMuxingAppAsUTF8 = NULL;

  delete[] m_pWritingAppAsUTF8;
  m_pWritingAppAsUTF8 = NULL;

  delete[] m_pTitleAsUTF8;
  m_pTitleAsUTF8 = NULL;
}